

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonlinearSolvers.cpp
# Opt level: O2

double DiscreteNewtonsMethod(double start,Func1D *f,double h,double eps,int *iterations)

{
  double dVar1;
  __0 *this;
  _Any_data local_68;
  code *local_58;
  code *pcStack_50;
  anon_class_40_2_94731ee7 df;
  
  df.h = h;
  std::function<double_(double)>::function(&df.f,f);
  local_58 = (code *)0x0;
  pcStack_50 = (code *)0x0;
  local_68._M_unused._M_object = (void *)0x0;
  local_68._8_8_ = 0;
  this = (__0 *)operator_new(0x28);
  DiscreteNewtonsMethod(double,std::function<double(double)>const&,double,double,int&)::$_0::__0
            (this,&df);
  pcStack_50 = std::
               _Function_handler<double_(double),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sMeDDveD[P]CalculationMethodsLab2/Sources/NonlinearSolvers.cpp:22:15)>
               ::_M_invoke;
  local_58 = std::
             _Function_handler<double_(double),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sMeDDveD[P]CalculationMethodsLab2/Sources/NonlinearSolvers.cpp:22:15)>
             ::_M_manager;
  local_68._M_unused._0_8_ = (undefined8)this;
  dVar1 = NewtonsMethod(start,f,(Func1D *)&local_68,eps,iterations);
  std::_Function_base::~_Function_base((_Function_base *)&local_68);
  std::_Function_base::~_Function_base(&df.f.super__Function_base);
  return dVar1;
}

Assistant:

double DiscreteNewtonsMethod(double start, const Func1D &f, double h, double eps, int &iterations)
{
    auto df = [h, f](double x)
    { return (f(x + h) - f(x)) / h; };

    return NewtonsMethod(start, f, df, eps, iterations);
}